

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.h
# Opt level: O2

TypeCluster * __thiscall
BayesianGameWithClusterInfo::GetTypeCluster(BayesianGameWithClusterInfo *this,Index agI,Index tcI)

{
  const_reference ppvVar1;
  reference ppTVar2;
  
  ppvVar1 = std::
            vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ::at(&this->_m_typeLists,(ulong)agI);
  ppTVar2 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at(*ppvVar1,(ulong)tcI);
  return *ppTVar2;
}

Assistant:

const TypeCluster* GetTypeCluster(Index agI, Index tcI) const
        {return _m_typeLists.at(agI)->at(tcI);}